

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprCompare(Parse *pParse,Expr *pA,Expr *pB,int iTab)

{
  u8 uVar1;
  char *__s1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  byte bVar5;
  long lVar6;
  uint uVar7;
  
  if (pA == (Expr *)0x0 || pB == (Expr *)0x0) {
    return (uint)(pB != pA) * 2;
  }
  if ((pParse != (Parse *)0x0) && (pA->op == 0x9d)) {
    iVar3 = exprCompareVariable(pParse,pA,pB);
    return iVar3;
  }
  uVar7 = pB->flags | pA->flags;
  if ((uVar7 >> 0xb & 1) != 0) {
    if ((((pA->flags & pB->flags) >> 0xb & 1) != 0) && ((pA->u).iValue == (pB->u).iValue)) {
      return 0;
    }
    return 2;
  }
  bVar2 = pA->op;
  bVar5 = pB->op;
  if (bVar2 == 0x48 || bVar2 != bVar5) {
    if (bVar2 == 0x72) {
      uVar4 = sqlite3ExprCompare(pParse,pA->pLeft,pB,iTab);
      if (uVar4 < 2) {
        return 1;
      }
      bVar5 = pB->op;
    }
    if ((bVar5 == 0x72) && (uVar4 = sqlite3ExprCompare(pParse,pA,pB->pLeft,iTab), uVar4 < 2)) {
      return 1;
    }
    if (pA->op != 0xaa) {
      return 2;
    }
    if (pB->op != 0xa8) {
      return 2;
    }
    if (-1 < pB->iTable) {
      return 2;
    }
    bVar2 = 0xaa;
    if (pA->iTable != iTab) {
      return 2;
    }
  }
  __s1 = (pA->u).zToken;
  if (__s1 == (char *)0x0) goto LAB_0017b40f;
  if (bVar2 < 0xa9) {
    if (bVar2 == 0x72) {
      if ((pB->u).zToken == (char *)0x0) {
        return 2;
      }
      lVar6 = 0;
      do {
        bVar2 = __s1[lVar6];
        bVar5 = (pB->u).zToken[lVar6];
        if (bVar2 == bVar5) {
          if ((ulong)bVar2 == 0) goto LAB_0017b40f;
        }
        else if (""[bVar2] != ""[bVar5]) {
          return 2;
        }
        lVar6 = lVar6 + 1;
      } while( true );
    }
    if (bVar2 == 0x7a) {
      return 0;
    }
  }
  else if ((bVar2 == 0xac) || (bVar2 == 0xa9)) {
    lVar6 = 0;
    do {
      bVar2 = __s1[lVar6];
      if (bVar2 == (pB->u).zToken[lVar6]) {
        if ((ulong)bVar2 == 0) goto LAB_0017b3d4;
      }
      else if (""[bVar2] != ""[(byte)(pB->u).zToken[lVar6]]) {
        return 2;
      }
      lVar6 = lVar6 + 1;
    } while( true );
  }
  if ((bVar2 & 0xfd) == 0xa8 || (pB->u).zToken == (char *)0x0) goto LAB_0017b40f;
  iVar3 = strcmp(__s1,(pB->u).zToken);
LAB_0017b40b:
  if (iVar3 != 0) {
    return 2;
  }
LAB_0017b40f:
  if (((pB->flags ^ pA->flags) & 0x404) != 0) {
    return 2;
  }
  if ((uVar7 >> 0x10 & 1) == 0) {
    if ((uVar7 >> 0xc & 1) != 0) {
      return 2;
    }
    if (((uVar7 & 0x20) == 0) &&
       (iVar3 = sqlite3ExprCompare(pParse,pA->pLeft,pB->pLeft,iTab), iVar3 != 0)) {
      return 2;
    }
    iVar3 = sqlite3ExprCompare(pParse,pA->pRight,pB->pRight,iTab);
    if (iVar3 != 0) {
      return 2;
    }
    iVar3 = sqlite3ExprListCompare((pA->x).pList,(pB->x).pList,iTab);
    if (iVar3 != 0) {
      return 2;
    }
    uVar1 = pA->op;
    if (((uVar1 != 'v') && (uVar1 != 0xab)) && ((uVar7 >> 0xe & 1) == 0)) {
      if (pA->iColumn != pB->iColumn) {
        return 2;
      }
      if ((uVar1 == 0xaf) && (pA->op2 != pB->op2)) {
        return 2;
      }
      if (((uVar1 != '2') && (pA->iTable != iTab)) && (pA->iTable != pB->iTable)) {
        return 2;
      }
    }
  }
  return 0;
LAB_0017b3d4:
  uVar4 = pA->flags & 0x1000000;
  if (uVar4 >> 0x18 != (uint)((pB->flags >> 0x18 & 1) != 0)) {
    return 2;
  }
  if (uVar4 == 0) goto LAB_0017b40f;
  iVar3 = sqlite3WindowCompare(pParse,(pA->y).pWin,(pB->y).pWin,1);
  goto LAB_0017b40b;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCompare(
  const Parse *pParse,
  const Expr *pA,
  const Expr *pB,
  int iTab
){
  u32 combinedFlags;
  if( pA==0 || pB==0 ){
    return pB==pA ? 0 : 2;
  }
  if( pParse && pA->op==TK_VARIABLE ){
    return exprCompareVariable(pParse, pA, pB);
  }
  combinedFlags = pA->flags | pB->flags;
  if( combinedFlags & EP_IntValue ){
    if( (pA->flags&pB->flags&EP_IntValue)!=0 && pA->u.iValue==pB->u.iValue ){
      return 0;
    }
    return 2;
  }
  if( pA->op!=pB->op || pA->op==TK_RAISE ){
    if( pA->op==TK_COLLATE && sqlite3ExprCompare(pParse, pA->pLeft,pB,iTab)<2 ){
      return 1;
    }
    if( pB->op==TK_COLLATE && sqlite3ExprCompare(pParse, pA,pB->pLeft,iTab)<2 ){
      return 1;
    }
    if( pA->op==TK_AGG_COLUMN && pB->op==TK_COLUMN
     && pB->iTable<0 && pA->iTable==iTab
    ){
      /* fall through */
    }else{
      return 2;
    }
  }
  assert( !ExprHasProperty(pA, EP_IntValue) );
  assert( !ExprHasProperty(pB, EP_IntValue) );
  if( pA->u.zToken ){
    if( pA->op==TK_FUNCTION || pA->op==TK_AGG_FUNCTION ){
      if( sqlite3StrICmp(pA->u.zToken,pB->u.zToken)!=0 ) return 2;
#ifndef SQLITE_OMIT_WINDOWFUNC
      assert( pA->op==pB->op );
      if( ExprHasProperty(pA,EP_WinFunc)!=ExprHasProperty(pB,EP_WinFunc) ){
        return 2;
      }
      if( ExprHasProperty(pA,EP_WinFunc) ){
        if( sqlite3WindowCompare(pParse, pA->y.pWin, pB->y.pWin, 1)!=0 ){
          return 2;
        }
      }
#endif
    }else if( pA->op==TK_NULL ){
      return 0;
    }else if( pA->op==TK_COLLATE ){
      if( sqlite3_stricmp(pA->u.zToken,pB->u.zToken)!=0 ) return 2;
    }else
    if( pB->u.zToken!=0
     && pA->op!=TK_COLUMN
     && pA->op!=TK_AGG_COLUMN
     && strcmp(pA->u.zToken,pB->u.zToken)!=0
    ){
      return 2;
    }
  }
  if( (pA->flags & (EP_Distinct|EP_Commuted))
     != (pB->flags & (EP_Distinct|EP_Commuted)) ) return 2;
  if( ALWAYS((combinedFlags & EP_TokenOnly)==0) ){
    if( combinedFlags & EP_xIsSelect ) return 2;
    if( (combinedFlags & EP_FixedCol)==0
     && sqlite3ExprCompare(pParse, pA->pLeft, pB->pLeft, iTab) ) return 2;
    if( sqlite3ExprCompare(pParse, pA->pRight, pB->pRight, iTab) ) return 2;
    if( sqlite3ExprListCompare(pA->x.pList, pB->x.pList, iTab) ) return 2;
    if( pA->op!=TK_STRING
     && pA->op!=TK_TRUEFALSE
     && ALWAYS((combinedFlags & EP_Reduced)==0)
    ){
      if( pA->iColumn!=pB->iColumn ) return 2;
      if( pA->op2!=pB->op2 && pA->op==TK_TRUTH ) return 2;
      if( pA->op!=TK_IN && pA->iTable!=pB->iTable && pA->iTable!=iTab ){
        return 2;
      }
    }
  }
  return 0;
}